

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<float,_2,_2> __thiscall
tcu::operator*(tcu *this,Matrix<float,_2,_2> *a,Matrix<float,_2,_2> *b)

{
  int row;
  long lVar1;
  Vector<float,_2> *pVVar2;
  long lVar3;
  long lVar4;
  float v;
  float extraout_XMM0_Qa [2];
  Vector<float,_2> VVar5;
  Vector<float,_2> in_XMM1_Qa;
  Matrix<float,_2,_2> MVar6;
  
  Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  VVar5.m_data = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    pVVar2 = (Vector<float,_2> *)b;
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      VVar5.m_data[0] = 0.0;
      VVar5.m_data[1] = 0.0;
      for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
        in_XMM1_Qa.m_data[0] =
             *(float *)((long)a + lVar4 * 2 * 4) *
             ((Vector<tcu::Vector<float,_2>,_2> *)pVVar2->m_data)->m_data[0].m_data[lVar4];
        in_XMM1_Qa.m_data[1] = 0.0;
        VVar5.m_data[0] = VVar5.m_data[0] + in_XMM1_Qa.m_data[0];
        VVar5.m_data[1] = 0.0;
      }
      *(float *)(this + lVar3 * 8 + lVar1 * 4) = VVar5.m_data[0];
      pVVar2 = pVVar2 + 1;
    }
    a = (Matrix<float,_2,_2> *)((long)a + 4);
  }
  MVar6.m_data.m_data[1].m_data[0] = in_XMM1_Qa.m_data[0];
  MVar6.m_data.m_data[1].m_data[1] = in_XMM1_Qa.m_data[1];
  MVar6.m_data.m_data[0].m_data[0] = VVar5.m_data[0];
  MVar6.m_data.m_data[0].m_data[1] = VVar5.m_data[1];
  return (Matrix<float,_2,_2>)MVar6.m_data.m_data;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}